

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

string * __thiscall
pbrt::SceneEntity::ToString_abi_cxx11_(string *__return_storage_ptr__,SceneEntity *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&>
            (__return_storage_ptr__,"[ SceneEntity name: %s parameters: %s loc: %s ]",&this->name,
             &this->parameters,&this->loc);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ SceneEntity name: %s parameters: %s loc: %s ]", name,
                            parameters, loc);
    }